

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_dialer_close(void *arg)

{
  undefined8 local_20;
  nni_ws *ws;
  nni_ws_dialer *d;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x58));
  if ((*(byte *)((long)arg + 0xe0) & 1) == 0) {
    *(undefined1 *)((long)arg + 0xe0) = 1;
    for (local_20 = nni_list_first((nni_list *)((long)arg + 200)); local_20 != (void *)0x0;
        local_20 = nni_list_next((nni_list *)((long)arg + 200),local_20)) {
      nni_aio_close((nni_aio *)((long)local_20 + 0x818));
      nni_aio_close((nni_aio *)((long)local_20 + 0x650));
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x58));
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x58));
  }
  return;
}

Assistant:

static void
ws_dialer_close(void *arg)
{
	nni_ws_dialer *d = arg;
	nni_ws        *ws;
	nni_mtx_lock(&d->mtx);
	if (d->closed) {
		nni_mtx_unlock(&d->mtx);
		return;
	}
	d->closed = true;
	NNI_LIST_FOREACH (&d->wspend, ws) {
		nni_aio_close(&ws->connaio);
		nni_aio_close(&ws->httpaio);
	}
	nni_mtx_unlock(&d->mtx);
}